

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZEllipse3D>::Write
          (TPZGeoElRefPattern<pzgeom::TPZEllipse3D> *this,TPZStream *str,int withclassid)

{
  int refpatternindex;
  
  TPZGeoElRefLess<pzgeom::TPZEllipse3D>::Write
            (&this->super_TPZGeoElRefLess<pzgeom::TPZEllipse3D>,str,withclassid);
  TPZStream::Write<long>(str,&this->fSubEl);
  (*str->_vptr_TPZStream[3])(str,&refpatternindex,1);
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Write(TPZStream &str, int withclassid) const {
    TPZGeoElRefLess<TGeo>::Write(str, withclassid);
    str.Write(this->fSubEl);
    int refpatternindex = -1;
    if (fRefPattern) refpatternindex = fRefPattern->Id();
    str.Write(&refpatternindex, 1);
}